

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_recho(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *in_RSI;
  long in_RDI;
  char buffer [9216];
  DESCRIPTOR_DATA *d;
  CHAR_DATA *in_stack_ffffffffffffdbd8;
  CHAR_DATA *in_stack_ffffffffffffdbe8;
  CHAR_DATA *in_stack_ffffffffffffdbf0;
  char *in_stack_ffffffffffffdbf8;
  char *in_stack_ffffffffffffdc00;
  DESCRIPTOR_DATA *local_18;
  
  if (*in_RSI == '\0') {
    send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
  }
  else {
    for (local_18 = descriptor_list; local_18 != (DESCRIPTOR_DATA *)0x0; local_18 = local_18->next)
    {
      if ((local_18->connected == 0) &&
         (local_18->character->in_room == *(ROOM_INDEX_DATA **)(in_RDI + 0xa8))) {
        colorconv(in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0);
        iVar2 = get_trust(in_stack_ffffffffffffdbd8);
        iVar3 = get_trust(in_stack_ffffffffffffdbd8);
        if (iVar3 <= iVar2) {
          bVar1 = is_npc(in_stack_ffffffffffffdbd8);
          if (!bVar1) {
            send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
          }
        }
        send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
        send_to_char((char *)in_stack_ffffffffffffdbf0,in_stack_ffffffffffffdbe8);
      }
    }
  }
  return;
}

Assistant:

void do_recho(CHAR_DATA *ch, char *argument)
{
	DESCRIPTOR_DATA *d;
	char buffer[MAX_STRING_LENGTH * 2];

	if (argument[0] == '\0')
	{
		send_to_char("Local echo what?\n\r", ch);
		return;
	}

	for (d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING && d->character->in_room == ch->in_room)
		{
			colorconv(buffer, argument, d->character);

			if (get_trust(d->character) >= get_trust(ch) && !is_npc(ch))
				send_to_char("local> ", d->character);

			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}